

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_prediction_scheme_geometric_normal_decoder.h
# Opt level: O2

void __thiscall
draco::
MeshPredictionSchemeGeometricNormalDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
::MeshPredictionSchemeGeometricNormalDecoder
          (MeshPredictionSchemeGeometricNormalDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
           *this,PointAttribute *attribute,
          PredictionSchemeWrapDecodingTransform<int,_int> *transform,
          MeshPredictionSchemeData<draco::CornerTable> *mesh_data)

{
  CornerTable *pCVar1;
  vector<int,_std::allocator<int>_> *pvVar2;
  vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
  *pvVar3;
  
  MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
  ::MeshPredictionSchemeDecoder
            (&this->
              super_MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
             ,attribute,transform,mesh_data);
  (this->
  super_MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
  ).super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>.
  super_PredictionSchemeTypedDecoderInterface<int,_int>.super_PredictionSchemeDecoderInterface.
  super_PredictionSchemeInterface._vptr_PredictionSchemeInterface =
       (_func_int **)&PTR__MeshPredictionSchemeGeometricNormalDecoder_001d1c38;
  (this->predictor_).
  super_MeshPredictionSchemeGeometricNormalPredictorBase<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
  ._vptr_MeshPredictionSchemeGeometricNormalPredictorBase =
       (_func_int **)&PTR__MeshPredictionSchemeGeometricNormalPredictorBase_001d1d20;
  (this->predictor_).
  super_MeshPredictionSchemeGeometricNormalPredictorBase<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
  .pos_attribute_ = (PointAttribute *)0x0;
  (this->predictor_).
  super_MeshPredictionSchemeGeometricNormalPredictorBase<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
  .entry_to_point_id_map_ = (PointIndex *)0x0;
  pCVar1 = mesh_data->corner_table_;
  pvVar2 = mesh_data->vertex_to_data_map_;
  pvVar3 = mesh_data->data_to_corner_map_;
  (this->predictor_).
  super_MeshPredictionSchemeGeometricNormalPredictorBase<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
  .mesh_data_.mesh_ = mesh_data->mesh_;
  (this->predictor_).
  super_MeshPredictionSchemeGeometricNormalPredictorBase<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
  .mesh_data_.corner_table_ = pCVar1;
  (this->predictor_).
  super_MeshPredictionSchemeGeometricNormalPredictorBase<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
  .mesh_data_.vertex_to_data_map_ = pvVar2;
  (this->predictor_).
  super_MeshPredictionSchemeGeometricNormalPredictorBase<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
  .mesh_data_.data_to_corner_map_ = pvVar3;
  (this->predictor_).
  super_MeshPredictionSchemeGeometricNormalPredictorBase<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
  ._vptr_MeshPredictionSchemeGeometricNormalPredictorBase =
       (_func_int **)&PTR__MeshPredictionSchemeGeometricNormalPredictorBase_001d1cc0;
  (this->predictor_).
  super_MeshPredictionSchemeGeometricNormalPredictorBase<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
  .normal_prediction_mode_ = TRIANGLE_AREA;
  (this->octahedron_tool_box_).quantization_bits_ = -1;
  (this->octahedron_tool_box_).max_quantized_value_ = -1;
  (this->octahedron_tool_box_).max_value_ = -1;
  (this->octahedron_tool_box_).dequantization_scale_ = 1.0;
  (this->octahedron_tool_box_).center_value_ = -1;
  RAnsBitDecoder::RAnsBitDecoder(&this->flip_normal_bit_decoder_);
  return;
}

Assistant:

MeshPredictionSchemeGeometricNormalDecoder(const PointAttribute *attribute,
                                             const TransformT &transform,
                                             const MeshDataT &mesh_data)
      : MeshPredictionSchemeDecoder<DataTypeT, TransformT, MeshDataT>(
            attribute, transform, mesh_data),
        predictor_(mesh_data) {}